

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O2

void __thiscall OpenMD::UniformField::modifyForces(UniformField *this)

{
  Vector3d *v1;
  AtomType *pAVar1;
  long lVar2;
  Snapshot *this_00;
  bool bVar3;
  bool bVar4;
  Molecule *pMVar5;
  long lVar6;
  pointer ppAVar7;
  Atom *this_01;
  double dVar8;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  Vector3d r;
  Vector3d D;
  Vector3d f;
  Vector3d t;
  potVec longRangePotential;
  double local_198;
  double local_188;
  FixedChargeAdapter local_178;
  MoleculeIterator local_170;
  Molecule *local_168;
  MultipoleAdapter local_160;
  FluctuatingChargeAdapter local_158;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  potVec local_d8;
  Vector<double,_7U> local_a0;
  Vector<double,_7U> local_68;
  
  if (this->initialized == false) {
    initialize(this);
  }
  local_170._M_node = (_Base_ptr)0x0;
  local_d8.data_[0] = 0.0;
  Vector<double,_7U>::Vector(&local_a0,local_d8.data_);
  Vector<double,_3U>::Vector(&local_120);
  Vector<double,_3U>::Vector(&local_f0);
  Vector<double,_3U>::Vector(&local_108);
  Vector<double,_3U>::Vector(&local_150);
  if (this->doUniformField == true) {
    pMVar5 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_170);
    v1 = &this->EF;
    local_198 = 0.0;
    while (pMVar5 != (Molecule *)0x0) {
      ppAVar7 = (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_168 = pMVar5;
      if (ppAVar7 !=
          (pMVar5->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_001fa1ed;
      this_01 = (Atom *)0x0;
      while (this_01 != (Atom *)0x0) {
        pAVar1 = this_01->atomType_;
        StuntDouble::getPos((Vector3d *)&local_d8,&this_01->super_StuntDouble);
        Vector<double,_3U>::operator=(&local_150,(Vector<double,_3U> *)&local_d8);
        Snapshot::wrapVector
                  (((this->super_ForceModifier).info_)->sman_->currentSnapshot_,
                   (Vector3d *)&local_150);
        operator*(&local_138,&v1->super_Vector<double,_3U>,23.0609);
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_d8,&local_138);
        StuntDouble::addElectricField(&this_01->super_StuntDouble,(Vector3d *)&local_d8);
        local_178.at_ = pAVar1;
        bVar3 = FixedChargeAdapter::isFixedCharge(&local_178);
        local_188 = 0.0;
        if (bVar3) {
          local_188 = FixedChargeAdapter::getCharge(&local_178);
        }
        local_158.at_ = pAVar1;
        bVar4 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_158);
        if (bVar4) {
          local_188 = local_188 +
                      *(double *)
                       (*(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->
                                          currentSnapshot_->atomData).flucQPos.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start +
                                 (this_01->super_StuntDouble).storage_) +
                       (long)(this_01->super_StuntDouble).localIndex_ * 8);
          dVar8 = dot<double,3u>(&local_150,&v1->super_Vector<double,_3U>);
          lVar6 = (long)(this_01->super_StuntDouble).localIndex_;
          lVar2 = *(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).flucQFrc.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (this_01->super_StuntDouble).storage_);
          *(double *)(lVar2 + lVar6 * 8) = dVar8 * 23.0609 + *(double *)(lVar2 + lVar6 * 8);
LAB_001fa075:
          operator*(&local_138,&v1->super_Vector<double,_3U>,local_188);
          operator*((Vector<double,_3U> *)&local_d8,&local_138,23.0609);
          Vector3<double>::operator=((Vector3<double> *)&local_108,(Vector<double,_3U> *)&local_d8);
          StuntDouble::addFrc(&this_01->super_StuntDouble,(Vector3d *)&local_108);
          dVar8 = dot<double,3u>(&local_150,&local_108);
          if (this->doParticlePot == true) {
            lVar6 = (long)(this_01->super_StuntDouble).localIndex_;
            lVar2 = *(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_01->super_StuntDouble).storage_);
            *(double *)(lVar2 + lVar6 * 8) = *(double *)(lVar2 + lVar6 * 8) - dVar8;
          }
          local_198 = local_198 - dVar8;
        }
        else if (bVar3) goto LAB_001fa075;
        local_160.at_ = pAVar1;
        bVar3 = MultipoleAdapter::isDipole(&local_160);
        if (bVar3) {
          StuntDouble::getDipole((Vector3d *)&local_138,&this_01->super_StuntDouble);
          operator*((Vector<double,_3U> *)&local_d8,&local_138,4.8018969509);
          Vector3<double>::operator=((Vector3<double> *)&local_120,(Vector<double,_3U> *)&local_d8);
          cross<double>((Vector3<double> *)&local_d8,(Vector3<double> *)&local_120,v1);
          Vector<double,_3U>::operator=(&local_f0,(Vector<double,_3U> *)&local_d8);
          StuntDouble::addTrq(&this_01->super_StuntDouble,(Vector3d *)&local_f0);
          dVar8 = dot<double,3u>(&local_120,&v1->super_Vector<double,_3U>);
          if (this->doParticlePot == true) {
            lVar6 = (long)(this_01->super_StuntDouble).localIndex_;
            lVar2 = *(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_01->super_StuntDouble).storage_);
            *(double *)(lVar2 + lVar6 * 8) = *(double *)(lVar2 + lVar6 * 8) - dVar8;
          }
          local_198 = local_198 - dVar8;
        }
        ppAVar7 = ppAVar7 + 1;
        this_01 = (Atom *)0x0;
        if (ppAVar7 !=
            (local_168->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_001fa1ed:
          this_01 = *ppAVar7;
        }
      }
      pMVar5 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_170);
    }
    this_00 = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials(&local_d8,this_00);
    Vector<double,_7U>::operator=(&local_a0,&local_d8);
    local_a0.data_[2] = local_198 + local_a0.data_[2];
    Vector<double,_7U>::Vector(&local_68,&local_a0);
    Snapshot::setLongRangePotentials(this_00,&local_68);
  }
  return;
}

Assistant:

void UniformField::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);

    RealType C;
    Vector3d D;
    RealType U;
    RealType fPot;
    Vector3d t;
    Vector3d f;
    Vector3d r;

    bool isCharge;

    if (doUniformField) {
      U    = 0.0;
      fPot = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          // ad-hoc choice of the origin for potential calculation and
          // fluctuating charge force:

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          atom->addElectricField(EF * Constants::chargeFieldConvert);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF) * Constants::chargeFieldConvert);
          }

          if (isCharge) {
            f = EF * C * Constants::chargeFieldConvert;
            atom->addFrc(f);
            U = -dot(r, f);

            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            t = cross(D, EF);
            atom->addTrq(t);

            U = -dot(D, EF);

            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }